

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMAController.cpp
# Opt level: O0

ssize_t __thiscall
Atari::ST::DMAController::read(DMAController *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ssize_t sVar5;
  ushort uVar6;
  ushort uVar7;
  int address_local;
  DMAController *this_local;
  
  uVar3 = __fd & 7;
  uVar4 = (ulong)(uVar3 - 6);
  if (uVar3 - 2 < 4 || uVar3 - 6 == 0) {
    switch(uVar3) {
    case 0:
      if ((this->control_ & 0x10) == 0) {
        uVar4 = 0;
        if ((this->control_ & 8) == 0) {
          sVar5 = WD::WD1770::read(&(this->fdc_).super_WD1770,(int)(uint)this->control_ >> 1,__buf,
                                   0xa4d67c);
          this_local._6_2_ = (ushort)sVar5 & 0xff | 0xff00;
          uVar4 = 0;
        }
        else {
          this_local._6_2_ = 0xffff;
        }
      }
      else {
        uVar3 = this->byte_count_ + 0x1ff >> 9;
        uVar4 = (ulong)uVar3;
        this_local._6_2_ = (ushort)uVar3;
      }
      break;
    case 1:
      bVar1 = this->error_;
      uVar6 = 0;
      if (this->byte_count_ != 0) {
        uVar6 = 2;
      }
      bVar2 = WD::WD1770::get_data_request_line(&(this->fdc_).super_WD1770);
      uVar7 = 0;
      if (bVar2) {
        uVar7 = 4;
      }
      this_local._6_2_ = (bVar1 & 1U) == 0 | 0xfff8 | uVar6 | uVar7;
      uVar4 = 0;
      break;
    case 2:
      this_local._6_2_ = (ushort)((uint)this->address_ >> 0x10) & 0xff | 0xff00;
      uVar4 = 0;
      break;
    case 3:
      this_local._6_2_ = (ushort)((uint)this->address_ >> 8) & 0xff | 0xff00;
      uVar4 = 0;
      break;
    case 4:
      this_local._6_2_ = (ushort)this->address_ & 0xff | 0xff00;
      uVar4 = 0;
    }
  }
  else {
    this_local._6_2_ = 0xffff;
  }
  return CONCAT62((int6)(uVar4 >> 0x10),this_local._6_2_);
}

Assistant:

uint16_t DMAController::read(int address) {
	switch(address & 7) {
		// Reserved.
		default: break;

		// Disk controller or sector count.
		case 2:
			if(control_ & Control::SectorCountSelect) {
				return uint16_t((byte_count_ + 511) >> 9);	// Assumed here: the count is of sectors remaining, i.e. it decrements
															// only when a sector is complete.
			} else {
				if(control_ & Control::CPUTarget) {
					return 0xffff;
				} else {
					return 0xff00 | fdc_.read(control_ >> 1);
				}
			}
		break;

		// DMA status.
		case 3:
		// TODO: should DRQ come from the HDC if that mode is selected?
		return 0xfff8 | (error_ ? 0 : 1) | (byte_count_ ? 2 : 0) | (fdc_.get_data_request_line() ? 4 : 0);

		// DMA addressing.
		case 4:	return uint16_t(0xff00 | ((address_ >> 16) & 0xff));
		case 5:	return uint16_t(0xff00 | ((address_ >> 8) & 0xff));
		case 6:	return uint16_t(0xff00 | ((address_ >> 0) & 0xff));
	}
	return 0xffff;
}